

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O3

void __thiscall
WorkerQueue<QueryDatabaseSearcherWorker<Protein>,_std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<Protein>_*,_const_SearchParams<Protein>_&>
::WorkerLoop(WorkerQueue<QueryDatabaseSearcherWorker<Protein>,_std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<Protein>_*,_const_SearchParams<Protein>_&>
             *this,WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                   **args,Database<Protein> **args_1,SearchParams<Protein> *args_2)

{
  deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> *this_00;
  long lVar1;
  _Map_pointer ppSVar2;
  size_t sVar3;
  _Elt_pointer pSVar4;
  _Elt_pointer pSVar5;
  _Elt_pointer pSVar6;
  _Map_pointer ppSVar7;
  _Elt_pointer pSVar8;
  _Elt_pointer pSVar9;
  _Elt_pointer pSVar10;
  long lVar11;
  deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> *pdVar12;
  SequenceList<Protein> *pSVar13;
  long lVar14;
  long lVar15;
  byte bVar16;
  undefined1 local_1a0 [8];
  QueryDatabaseSearcherWorker<Protein> worker;
  undefined1 auStack_a8 [8];
  deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> queueItem;
  unique_lock<std::mutex> lock_1;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lock;
  
  bVar16 = 0;
  queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>::_M_initialize_map
            ((_Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> *)auStack_a8,0);
  worker.mGlobalSearch.mBandedAlign.mParams._16_8_ = *args;
  worker.mGlobalSearch.super_Search<Protein>._vptr_Search = (_func_int **)*args_1;
  local_1a0 = (undefined1  [8])&PTR_SearchForHits_00199100;
  worker.mGlobalSearch.super_Search<Protein>.mParams = (SearchParams<Protein> *)0x0;
  worker.mGlobalSearch.mHits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  worker.mGlobalSearch.mHits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  worker.mGlobalSearch.mHits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x20;
  worker.mGlobalSearch.mHits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffec;
  worker.mGlobalSearch.mExtendAlign.mAP.xDrop = -2;
  worker.mGlobalSearch.mExtendAlign.mAP.gapExtendScore = 0;
  worker.mGlobalSearch.mExtendAlign._12_4_ = 0;
  worker.mGlobalSearch.mExtendAlign.mRow.
  super__Vector_base<ExtendAlign<Protein>::Cell,_std::allocator<ExtendAlign<Protein>::Cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  worker.mGlobalSearch.mExtendAlign.mRow.
  super__Vector_base<ExtendAlign<Protein>::Cell,_std::allocator<ExtendAlign<Protein>::Cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  worker.mGlobalSearch.mExtendAlign.mRow.
  super__Vector_base<ExtendAlign<Protein>::Cell,_std::allocator<ExtendAlign<Protein>::Cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  worker.mGlobalSearch.mExtendAlign.mOperations.
  super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  worker.mGlobalSearch.mExtendAlign.mOperations.
  super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  worker.mGlobalSearch.mExtendAlign.mOperations.
  super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mScores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mScores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mScores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mVerticalGaps.
  super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mVerticalGaps.
  super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mVerticalGaps.
  super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mOperations.
  super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mOperations.
  super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mOperations.
  super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x10;
  worker.mGlobalSearch.mBandedAlign.mParams.bandwidth = 0xfffffffeffffffec;
  worker.mGlobalSearch.mBandedAlign.mParams.interiorGapOpenScore = -2;
  worker.mGlobalSearch.mBandedAlign.mParams.interiorGapExtendScore = -1;
  worker.mGlobalSearch.super_Search<Protein>.mDB = (Database<Protein> *)args_2;
  while( true ) {
    lock._M_device._0_1_ = 0;
    local_40 = (undefined1  [8])(this + 0x80);
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
    lock._M_device._0_1_ = 1;
    while ((pSVar10 = queueItem.
                      super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_last,
           pSVar9 = queueItem.
                    super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first,
           pSVar8 = queueItem.
                    super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_cur,
           ppSVar7 = queueItem.
                     super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_node,
           pSVar6 = queueItem.
                    super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_last,
           pSVar5 = queueItem.
                    super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_first,
           pSVar4 = queueItem.
                    super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur,
           sVar3 = queueItem.
                   super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl
                   .super__Deque_impl_data._M_map_size,
           ppSVar2 = queueItem.
                     super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
                     _M_impl.super__Deque_impl_data._M_map, ((byte)this[0xa8] & 1) == 0 &&
           (*(long *)(this + 0xe0) == *(long *)(this + 0xc0)))) {
      std::condition_variable::wait((unique_lock *)(this + 0x50));
    }
    if (((byte)this[0xa8] & 1) != 0) break;
    this_00 = *(deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> **)(this + 0xc0);
    queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node = (_Map_pointer)auStack_a8;
    auStack_a8 = (undefined1  [8])0x0;
    queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
    super__Deque_impl_data._M_map_size = 0;
    queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
    super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
    super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
    super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
    super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
    super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    pdVar12 = this_00;
    pSVar13 = (SequenceList<Protein> *)auStack_a8;
    for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pSVar13->super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>)._M_impl.
      super__Deque_impl_data._M_map =
           (pdVar12->super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>).
           _M_impl.super__Deque_impl_data._M_map;
      pdVar12 = (deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> *)
                ((long)pdVar12 + ((ulong)bVar16 * -2 + 1) * 8);
      pSVar13 = (SequenceList<Protein> *)((long)pSVar13 + ((ulong)bVar16 * -2 + 1) * 8);
    }
    lock_1._M_device._0_4_ = SUB84(ppSVar2,0);
    lock_1._M_device._4_4_ = (undefined4)((ulong)ppSVar2 >> 0x20);
    *(undefined4 *)
     &(this_00->super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>)._M_impl.
      super__Deque_impl_data._M_map =
         queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl
         .super__Deque_impl_data._M_finish._M_node._0_4_;
    *(undefined4 *)
     ((long)&(this_00->super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>).
             _M_impl.super__Deque_impl_data._M_map + 4) =
         queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl
         .super__Deque_impl_data._M_finish._M_node._4_4_;
    *(undefined4 *)
     &(this_00->super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>)._M_impl.
      super__Deque_impl_data._M_map_size = lock_1._M_device._0_4_;
    *(undefined4 *)
     ((long)&(this_00->super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>).
             _M_impl.super__Deque_impl_data._M_map_size + 4) = lock_1._M_device._4_4_;
    (this_00->super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>)._M_impl.
    super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)sVar3;
    (this_00->super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>)._M_impl.
    super__Deque_impl_data._M_start._M_first = pSVar4;
    (this_00->super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>)._M_impl.
    super__Deque_impl_data._M_start._M_last = pSVar5;
    (this_00->super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>)._M_impl.
    super__Deque_impl_data._M_start._M_node = (_Map_pointer)pSVar6;
    (this_00->super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>)._M_impl.
    super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)ppSVar7;
    (this_00->super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>)._M_impl.
    super__Deque_impl_data._M_finish._M_first = pSVar8;
    (this_00->super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>)._M_impl.
    super__Deque_impl_data._M_finish._M_last = pSVar9;
    (this_00->super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>)._M_impl.
    super__Deque_impl_data._M_finish._M_node = (_Map_pointer)pSVar10;
    std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>::clear(this_00);
    std::
    deque<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::allocator<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>_>_>
    ::pop_front((deque<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::allocator<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>_>_>
                 *)(this + 0xb0));
    LOCK();
    *(int *)(this + 0xac) = *(int *)(this + 0xac) + 1;
    UNLOCK();
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    QueryDatabaseSearcherWorker<Protein>::Process
              ((QueryDatabaseSearcherWorker<Protein> *)local_1a0,(SequenceList<Protein> *)auStack_a8
              );
    queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node = (_Map_pointer)(this + 0x80);
    std::unique_lock<std::mutex>::lock
              ((unique_lock<std::mutex> *)
               &queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node);
    *(ulong *)(this + 0x108) =
         ((long)queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node -
          (long)queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur >> 5) * -0x5555555555555555 +
         (((long)queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_last -
           (long)queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last >> 3) + -1 +
         (ulong)(queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_last == (_Elt_pointer)0x0)) * 5 +
         *(long *)(this + 0x108) +
         ((long)((long)queueItem.
                       super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
                       _M_impl.super__Deque_impl_data._M_start._M_first -
                queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
                _M_impl.super__Deque_impl_data._M_map_size) >> 5) * -0x5555555555555555;
    LOCK();
    *(int *)(this + 0xac) = *(int *)(this + 0xac) + -1;
    UNLOCK();
    lVar11 = *(long *)(this + 0x120);
    lVar1 = *(long *)(this + 0x140);
    if (lVar11 != lVar1) {
      lVar15 = *(long *)(this + 0x130);
      lVar14 = *(long *)(this + 0x138);
      do {
        worker.mWriter = *(SearchResultsWriter<Protein> **)(this + 0x100);
        local_40 = *(undefined1 (*) [8])(this + 0x108);
        if (*(long *)(lVar11 + 0x10) == 0) {
          std::__throw_bad_function_call();
        }
        (**(code **)(lVar11 + 0x18))(lVar11,local_40,&worker.mWriter);
        lVar11 = lVar11 + 0x20;
        if (lVar11 == lVar15) {
          lVar11 = *(long *)(lVar14 + 8);
          lVar14 = lVar14 + 8;
          lVar15 = lVar11 + 0x200;
        }
      } while (lVar11 != lVar1);
    }
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               &queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  local_1a0 = (undefined1  [8])&PTR_SearchForHits_00199100;
  if (worker.mGlobalSearch.mBandedAlign.mVerticalGaps.
      super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(worker.mGlobalSearch.mBandedAlign.mVerticalGaps.
                    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (worker.mGlobalSearch.mBandedAlign.mScores.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(worker.mGlobalSearch.mBandedAlign.mScores.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage);
  }
  if (worker.mGlobalSearch.mExtendAlign.mOperations.
      super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(worker.mGlobalSearch.mExtendAlign.mOperations.
                    super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (worker.mGlobalSearch.mExtendAlign.mRow.
      super__Vector_base<ExtendAlign<Protein>::Cell,_std::allocator<ExtendAlign<Protein>::Cell>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(worker.mGlobalSearch.mExtendAlign.mRow.
                    super__Vector_base<ExtendAlign<Protein>::Cell,_std::allocator<ExtendAlign<Protein>::Cell>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (worker.mGlobalSearch.mExtendAlign._8_8_ != 0) {
    operator_delete((void *)worker.mGlobalSearch.mExtendAlign._8_8_);
  }
  if (worker.mGlobalSearch.super_Search<Protein>.mParams != (SearchParams<Protein> *)0x0) {
    operator_delete(worker.mGlobalSearch.super_Search<Protein>.mParams);
  }
  std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>::~deque
            ((deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> *)auStack_a8);
  return;
}

Assistant:

void WorkerLoop( Args&&... args ) {
    QueueItem queueItem;
    Worker    worker( std::forward< Args >( args )... );

    while( true ) {
      { // acquire lock
        std::unique_lock< std::mutex > lock( mQueueMutex );

        while( !mStop && mQueue.empty() )
          mCondition.wait( lock );

        if( mStop )
          break;

        queueItem = std::move( mQueue.front() );
        mQueue.pop();

        mWorkingCount++;
      } // release lock

      worker.Process( queueItem );

      { // acquire lock
        std::unique_lock< std::mutex > lock( mQueueMutex );
        mTotalProcessed += QueueItemInfo< QueueItem >::Count( queueItem );
        mWorkingCount--;

        for( auto& cb : mProcessedCallbacks ) {
          cb( mTotalProcessed, mTotalEnqueued );
        }
      } // release lock
    }
  }